

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

MatchInfoCollection * __thiscall
icu_63::TZDBTimeZoneNames::find
          (TZDBTimeZoneNames *this,UnicodeString *text,int32_t start,uint32_t types,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t local_64 [2];
  int32_t maxLen;
  undefined1 local_50 [8];
  TZDBNameSearchHandler handler;
  UErrorCode *status_local;
  uint32_t types_local;
  int32_t start_local;
  UnicodeString *text_local;
  TZDBTimeZoneNames *this_local;
  
  handler.fRegion = (char *)status;
  umtx_initOnce((UInitOnce *)&gTZDBNamesTrieInitOnce,prepareFind,status);
  UVar1 = ::U_FAILURE(*(UErrorCode *)handler.fRegion);
  if (UVar1 == '\0') {
    TZDBNameSearchHandler::TZDBNameSearchHandler
              ((TZDBNameSearchHandler *)local_50,types,this->fRegion);
    TextTrieMap::search(gTZDBNamesTrie,text,start,(TextTrieMapSearchResultHandler *)local_50,
                        (UErrorCode *)handler.fRegion);
    UVar1 = ::U_FAILURE(*(UErrorCode *)handler.fRegion);
    if (UVar1 == '\0') {
      local_64[0] = 0;
      this_local = (TZDBTimeZoneNames *)
                   TZDBNameSearchHandler::getMatches((TZDBNameSearchHandler *)local_50,local_64);
    }
    else {
      this_local = (TZDBTimeZoneNames *)0x0;
    }
    local_64[1] = 1;
    TZDBNameSearchHandler::~TZDBNameSearchHandler((TZDBNameSearchHandler *)local_50);
  }
  else {
    this_local = (TZDBTimeZoneNames *)0x0;
  }
  return (MatchInfoCollection *)this_local;
}

Assistant:

TZDBTimeZoneNames::MatchInfoCollection*
TZDBTimeZoneNames::find(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    umtx_initOnce(gTZDBNamesTrieInitOnce, &prepareFind, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    TZDBNameSearchHandler handler(types, fRegion);
    gTZDBNamesTrie->search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    int32_t maxLen = 0;
    return handler.getMatches(maxLen);
}